

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void DrawArmor(ABasicArmor *barmor,AHexenArmor *harmor,int x,int y)

{
  int iVar1;
  FTexture *pFVar2;
  double dVar3;
  char local_54 [8];
  char local_4c [12];
  char local_40 [8];
  char icon [7];
  int fontcolor;
  int i;
  double ac;
  int bestslot;
  int ap;
  int y_local;
  int x_local;
  AHexenArmor *harmor_local;
  ABasicArmor *barmor_local;
  
  ac._4_4_ = 0;
  ac._0_4_ = 4;
  if (harmor != (AHexenArmor *)0x0) {
    dVar3 = harmor->Slots[0] + harmor->Slots[1] + harmor->Slots[2] + harmor->Slots[3] +
            harmor->Slots[4];
    ac._4_4_ = (int)dVar3;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      ac._0_4_ = 0;
      for (stack0xffffffffffffffcc = 1; stack0xffffffffffffffcc < 4;
          register0x00000000 = stack0xffffffffffffffcc + 1) {
        if (harmor->Slots[ac._0_4_] <= harmor->Slots[stack0xffffffffffffffcc] &&
            harmor->Slots[stack0xffffffffffffffcc] != harmor->Slots[ac._0_4_]) {
          ac._0_4_ = stack0xffffffffffffffcc;
        }
      }
    }
  }
  if (barmor != (ABasicArmor *)0x0) {
    ac._4_4_ = (barmor->super_AArmor).super_AInventory.Amount + ac._4_4_;
  }
  if (ac._4_4_ != 0) {
    iVar1 = FIntCVar::operator_cast_to_int(&hud_armor_red);
    if (ac._4_4_ < iVar1) {
      local_4c[0] = '\x06';
      local_4c[1] = '\0';
      local_4c[2] = '\0';
      local_4c[3] = '\0';
    }
    else {
      iVar1 = FIntCVar::operator_cast_to_int(&hud_armor_yellow);
      if (ac._4_4_ < iVar1) {
        local_54[0] = '\x05';
        local_54[1] = '\0';
        local_54[2] = '\0';
        local_54[3] = '\0';
      }
      else {
        iVar1 = FIntCVar::operator_cast_to_int(&hud_armor_green);
        local_54[0] = '\a';
        local_54[1] = '\0';
        local_54[2] = '\0';
        local_54[3] = '\0';
        if (ac._4_4_ <= iVar1) {
          local_54[0] = '\x03';
          local_54[1] = '\0';
          local_54[2] = '\0';
          local_54[3] = '\0';
        }
      }
      local_4c[0] = local_54[0];
      local_4c[1] = local_54[1];
      local_4c[2] = local_54[2];
      local_4c[3] = local_54[3];
    }
    icon[0] = local_4c[0];
    icon[1] = local_4c[1];
    icon[2] = local_4c[2];
    icon[3] = local_4c[3];
    if ((harmor == (AHexenArmor *)0x0) || (3 < ac._0_4_)) {
      if (barmor != (ABasicArmor *)0x0) {
        pFVar2 = FTextureManager::operator[]
                           (&TexMan,(FTextureID)(barmor->super_AArmor).super_AInventory.Icon.texnum)
        ;
        DrawImageToBox(pFVar2,x,y,0x1f,0x11,0xc000);
      }
    }
    else {
      builtin_strncpy(local_40,"AR_1A0",7);
      if (ac._0_4_ == 1) {
        builtin_strncpy(local_40,"AR_2",4);
      }
      else if (ac._0_4_ == 2) {
        builtin_strncpy(local_40,"AR_3",4);
      }
      else if (ac._0_4_ == 3) {
        builtin_strncpy(local_40,"AR_4",4);
      }
      pFVar2 = FTextureManager::FindTexture(&TexMan,local_40,3,1);
      DrawImageToBox(pFVar2,x,y,0x1f,0x11,0xc000);
    }
    DrawHudNumber(HudFont,icon._0_4_,ac._4_4_,x + 0x21,y + 0x11,0xc000);
  }
  return;
}

Assistant:

static void DrawArmor(ABasicArmor * barmor, AHexenArmor * harmor, int x, int y)
{
	int ap = 0;
	int bestslot = 4;

	if (harmor)
	{
		auto ac = (harmor->Slots[0] + harmor->Slots[1] + harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4]);
		ap += int(ac);
		
		if (ac)
		{
			// Find the part of armor that protects the most
			bestslot = 0;
			for (int i = 1; i < 4; ++i)
			{
				if (harmor->Slots[i] > harmor->Slots[bestslot])
				{
					bestslot = i;
				}
			}
		}
	}

	if (barmor)
	{
		ap += barmor->Amount;
	}

	if (ap)
	{
		// decide on color
		int fontcolor =
			ap < hud_armor_red ? CR_RED :
			ap < hud_armor_yellow ? CR_GOLD :
			ap <= hud_armor_green ? CR_GREEN :
			CR_BLUE;


		// Use the sprite of one of the predefined Hexen armor bonuses.
		// This is not a very generic approach, but it is not possible
		// to truly create new types of Hexen armor bonus items anyway.
		if (harmor && bestslot < 4)
		{
			char icon[] = "AR_1A0";
			switch (bestslot)
			{
			case 1: icon[3] = '2'; break;
			case 2: icon[3] = '3'; break;
			case 3: icon[3] = '4'; break;
			default: break;
			}
			DrawImageToBox(TexMan.FindTexture(icon, FTexture::TEX_Sprite), x, y, 31, 17);
		}
		else if (barmor) DrawImageToBox(TexMan[barmor->Icon], x, y, 31, 17);
		DrawHudNumber(HudFont, fontcolor, ap, x + 33, y + 17);
	}
}